

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_scalar_split(secp256k1_scalar *full)

{
  int iVar1;
  secp256k1_scalar *in_RDI;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  secp256k1_scalar *in_stack_ffffffffffffff58;
  uchar *in_stack_ffffffffffffff60;
  secp256k1_scalar *in_stack_ffffffffffffff68;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  undefined1 local_88 [8];
  secp256k1_scalar *in_stack_ffffffffffffff80;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_scalar *in_stack_ffffffffffffff98;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_48;
  secp256k1_scalar local_28;
  secp256k1_scalar *local_8;
  
  local_8 = in_RDI;
  memset(local_88,0,0x20);
  secp256k1_scalar_split_lambda
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  secp256k1_scalar_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  secp256k1_scalar_add
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar1 = secp256k1_scalar_eq(&local_28,local_8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x16ce,"test condition failed: secp256k1_scalar_eq(&s, full)");
    abort();
  }
  iVar1 = secp256k1_scalar_is_high(&local_48);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)&stack0xffffffffffffff98);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  secp256k1_scalar_get_b32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar1 = secp256k1_memcmp_var(local_88,&stack0xffffffffffffff58,0x10);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x16d9,"test condition failed: secp256k1_memcmp_var(zero, tmp, 16) == 0");
    abort();
  }
  secp256k1_scalar_get_b32(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar1 = secp256k1_memcmp_var(local_88,&stack0xffffffffffffff58,0x10);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x16db,"test condition failed: secp256k1_memcmp_var(zero, tmp, 16) == 0");
    abort();
  }
  return;
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}